

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O0

void __thiscall cmComputeLinkInformation::AddFullItem(cmComputeLinkInformation *this,string *item)

{
  bool bVar1;
  PolicyStatus PVar2;
  long lVar3;
  char *string;
  ulong uVar4;
  bool local_143;
  Item local_128;
  Item local_f8;
  _Self local_c8;
  byte local_b9;
  string local_b8;
  _Self local_98;
  undefined1 local_90 [8];
  string name;
  undefined1 local_68 [8];
  string file;
  string local_38 [8];
  string generator;
  string *item_local;
  cmComputeLinkInformation *this_local;
  
  generator.field_2._8_8_ = item;
  bVar1 = CheckImplicitDirItem(this,item);
  if (bVar1) {
    return;
  }
  if (((this->NoSONameUsesPath & 1U) != 0) &&
     (bVar1 = CheckSharedLibNoSOName(this,(string *)generator.field_2._8_8_), bVar1)) {
    return;
  }
  (*this->GlobalGenerator->_vptr_cmGlobalGenerator[2])(local_38);
  PVar2 = cmTarget::GetPolicyStatusCMP0008(this->Target);
  if ((PVar2 != NEW) &&
     ((lVar3 = std::__cxx11::string::find((char *)local_38,0x97697f), lVar3 != -1 ||
      (lVar3 = std::__cxx11::string::find((char *)local_38,0x97698d), lVar3 != -1)))) {
    cmsys::SystemTools::GetFilenameName((string *)local_68,(string *)generator.field_2._8_8_);
    string = (char *)std::__cxx11::string::c_str();
    bVar1 = cmsys::RegularExpression::find(&this->ExtractAnyLibraryName,string);
    if (!bVar1) {
      HandleBadFullItem(this,(string *)generator.field_2._8_8_,(string *)local_68);
    }
    name.field_2._13_3_ = 0;
    name.field_2._M_local_buf[0xc] = !bVar1;
    std::__cxx11::string::~string((string *)local_68);
    if (name.field_2._12_4_ != 0) goto LAB_00706c47;
  }
  if ((this->LinkTypeEnabled & 1U) != 0) {
    cmsys::SystemTools::GetFilenameName((string *)local_90,(string *)generator.field_2._8_8_);
    bVar1 = cmsys::RegularExpression::find(&this->ExtractSharedLibraryName,(string *)local_90);
    if (bVar1) {
      SetCurrentLinkType(this,LinkShared);
    }
    else {
      bVar1 = cmsys::RegularExpression::find
                        (&this->ExtractStaticLibraryName,(string *)generator.field_2._8_8_);
      if (!bVar1) {
        SetCurrentLinkType(this,this->StartLinkType);
      }
    }
    std::__cxx11::string::~string((string *)local_90);
  }
  local_b9 = 0;
  local_143 = false;
  if ((this->OldLinkDirMode & 1U) != 0) {
    cmsys::SystemTools::GetFilenamePath(&local_b8,(string *)generator.field_2._8_8_);
    local_b9 = 1;
    local_98._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::find(&this->OldLinkDirMask,&local_b8);
    local_c8._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(&this->OldLinkDirMask);
    local_143 = std::operator==(&local_98,&local_c8);
  }
  if ((local_b9 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_b8);
  }
  if (local_143 != false) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->OldLinkDirItems,(value_type *)generator.field_2._8_8_);
  }
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    Item::Item(&local_f8,&this->LibLinkFileFlag,false,(cmTarget *)0x0);
    std::vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>::
    push_back(&this->Items,&local_f8);
    Item::~Item(&local_f8);
  }
  Item::Item(&local_128,(string *)generator.field_2._8_8_,true,(cmTarget *)0x0);
  std::vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>::
  push_back(&this->Items,&local_128);
  Item::~Item(&local_128);
  name.field_2._12_4_ = 0;
LAB_00706c47:
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void cmComputeLinkInformation::AddFullItem(std::string const& item)
{
  // Check for the implicit link directory special case.
  if(this->CheckImplicitDirItem(item))
    {
    return;
    }

  // Check for case of shared library with no builtin soname.
  if(this->NoSONameUsesPath && this->CheckSharedLibNoSOName(item))
    {
    return;
    }

  // Full path libraries should specify a valid library file name.
  // See documentation of CMP0008.
  std::string generator = this->GlobalGenerator->GetName();
  if(this->Target->GetPolicyStatusCMP0008() != cmPolicies::NEW &&
     (generator.find("Visual Studio") != generator.npos ||
      generator.find("Xcode") != generator.npos))
    {
    std::string file = cmSystemTools::GetFilenameName(item);
    if(!this->ExtractAnyLibraryName.find(file.c_str()))
      {
      this->HandleBadFullItem(item, file);
      return;
      }
    }

  // This is called to handle a link item that is a full path.
  // If the target is not a static library make sure the link type is
  // shared.  This is because dynamic-mode linking can handle both
  // shared and static libraries but static-mode can handle only
  // static libraries.  If a previous user item changed the link type
  // to static we need to make sure it is back to shared.
  if(this->LinkTypeEnabled)
    {
    std::string name = cmSystemTools::GetFilenameName(item);
    if(this->ExtractSharedLibraryName.find(name))
      {
      this->SetCurrentLinkType(LinkShared);
      }
    else if(!this->ExtractStaticLibraryName.find(item))
      {
      // We cannot determine the type.  Assume it is the target's
      // default type.
      this->SetCurrentLinkType(this->StartLinkType);
      }
    }

  // For compatibility with CMake 2.4 include the item's directory in
  // the linker search path.
  if(this->OldLinkDirMode &&
     this->OldLinkDirMask.find(cmSystemTools::GetFilenamePath(item)) ==
     this->OldLinkDirMask.end())
    {
    this->OldLinkDirItems.push_back(item);
    }

  // If this platform wants a flag before the full path, add it.
  if(!this->LibLinkFileFlag.empty())
    {
    this->Items.push_back(Item(this->LibLinkFileFlag, false));
    }

  // Now add the full path to the library.
  this->Items.push_back(Item(item, true));
}